

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redundancy_elimination.cpp
# Opt level: O1

Status __thiscall spvtools::opt::RedundancyEliminationPass::Process(RedundancyEliminationPass *this)

{
  Module *pMVar1;
  pointer puVar2;
  __uniq_ptr_data<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>,_true,_true>
  f;
  undefined8 *puVar3;
  DominatorTreeNode *bb;
  bool bVar4;
  DominatorAnalysis *pDVar5;
  Status SVar6;
  pointer puVar7;
  byte bVar8;
  byte bVar9;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  value_to_ids;
  ValueNumberTable vnTable;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  local_110;
  ValueNumberTable local_e0;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  local_60;
  
  local_e0.context_ = (this->super_LocalRedundancyEliminationPass).super_Pass.context_;
  local_e0.instruction_to_value_._M_h._M_buckets =
       &local_e0.instruction_to_value_._M_h._M_single_bucket;
  local_e0.instruction_to_value_._M_h._M_bucket_count = 1;
  local_e0.instruction_to_value_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_e0.instruction_to_value_._M_h._M_element_count = 0;
  local_e0.instruction_to_value_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_e0.instruction_to_value_._M_h._M_rehash_policy._M_next_resize = 0;
  local_e0.instruction_to_value_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_e0.id_to_value_._M_h._M_buckets = &local_e0.id_to_value_._M_h._M_single_bucket;
  local_e0.id_to_value_._M_h._M_bucket_count = 1;
  local_e0.id_to_value_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_e0.id_to_value_._M_h._M_element_count = 0;
  local_e0.id_to_value_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_e0.id_to_value_._M_h._M_rehash_policy._M_next_resize = 0;
  local_e0.id_to_value_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_e0.next_value_number_ = 1;
  ValueNumberTable::BuildDominatorTreeValueNumberTable(&local_e0);
  pMVar1 = (((this->super_LocalRedundancyEliminationPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  puVar7 = *(pointer *)
            &(pMVar1->functions_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
             ._M_impl;
  puVar2 = *(pointer *)
            ((long)&(pMVar1->functions_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
            + 8);
  if (puVar7 == puVar2) {
    SVar6 = SuccessWithoutChange;
  }
  else {
    bVar8 = 0;
    bVar9 = 0;
    do {
      f.
      super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>.
      _M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
      .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl =
           (puVar7->_M_t).
           super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
      ;
      if (*(pointer *)
           &(((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
               *)((long)f.
                        super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                        .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl + 0x98
                 ))->
            super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            )._M_impl !=
          *(pointer *)
           ((long)f.
                  super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                  .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl + 0xa0)) {
        pDVar5 = IRContext::GetDominatorAnalysis
                           ((this->super_LocalRedundancyEliminationPass).super_Pass.context_,
                            (Function *)
                            f.
                            super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                            .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl);
        local_110._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_110._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_110._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_110._M_impl.super__Rb_tree_header._M_header;
        local_110._M_impl.super__Rb_tree_header._M_node_count = 0;
        puVar3 = (pDVar5->super_DominatorAnalysisBase).tree_.roots_.
                 super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_110._M_impl.super__Rb_tree_header._M_header._M_right =
             local_110._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((long)(pDVar5->super_DominatorAnalysisBase).tree_.roots_.
                  super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 != 8) {
          __assert_fail("roots_.size() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dominator_tree.h"
                        ,0x90,"DominatorTreeNode *spvtools::opt::DominatorTree::GetRoot()");
        }
        bb = (DominatorTreeNode *)*puVar3;
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
        ::_Rb_tree(&local_60,&local_110);
        bVar4 = EliminateRedundanciesFrom
                          (this,bb,&local_e0,
                           (map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                            *)&local_60);
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
        ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent)
        ;
        bVar9 = bVar8;
        if (bVar4) {
          bVar9 = 1;
        }
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
        ::_M_erase(&local_110,
                   (_Link_type)local_110._M_impl.super__Rb_tree_header._M_header._M_parent);
        bVar8 = bVar9;
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar2);
    SVar6 = bVar9 ^ SuccessWithoutChange;
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_e0.id_to_value_._M_h);
  std::
  _Hashtable<spvtools::opt::Instruction,_std::pair<const_spvtools::opt::Instruction,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::Instruction,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::ComputeSameValue,_spvtools::opt::ValueTableHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<spvtools::opt::Instruction,_std::pair<const_spvtools::opt::Instruction,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::Instruction,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::ComputeSameValue,_spvtools::opt::ValueTableHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_e0);
  return SVar6;
}

Assistant:

Pass::Status RedundancyEliminationPass::Process() {
  bool modified = false;
  ValueNumberTable vnTable(context());

  for (auto& func : *get_module()) {
    if (func.IsDeclaration()) {
      continue;
    }

    // Build the dominator tree for this function. It is how the code is
    // traversed.
    DominatorTree& dom_tree =
        context()->GetDominatorAnalysis(&func)->GetDomTree();

    // Keeps track of all ids that contain a given value number. We keep
    // track of multiple values because they could have the same value, but
    // different decorations.
    std::map<uint32_t, uint32_t> value_to_ids;

    if (EliminateRedundanciesFrom(dom_tree.GetRoot(), vnTable, value_to_ids)) {
      modified = true;
    }
  }
  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}